

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O1

ErrorNumber callWithDefaults(char *funcName,double *input,int *input_int,int size)

{
  int *piVar1;
  TA_InputParameterType TVar2;
  TA_RetCode TVar3;
  uint uVar4;
  ErrorNumber EVar5;
  long lVar6;
  TA_Real *high;
  TA_Real *open;
  uint uVar7;
  double (*padVar8) [2000];
  TA_Real *low;
  TA_Real *close;
  TA_Real *volume;
  int (*paiVar9) [2000];
  ulong uVar10;
  undefined1 auVar11 [16];
  TA_ParamHolder *paramHolder;
  int outBegIdx;
  TA_FuncHandle *handle;
  TA_FuncInfo *funcInfo;
  int lookback;
  int outNbElement;
  TA_OutputParameterInfo *outputInfo;
  TA_InputParameterInfo *inputInfo;
  
  TVar3 = TA_GetFuncHandle(funcName,&handle);
  if (TVar3 == TA_SUCCESS) {
    TVar3 = TA_ParamHolderAlloc(handle,&paramHolder);
    if (TVar3 == TA_SUCCESS) {
      TA_GetFuncInfo(handle,&funcInfo);
      if (funcInfo->nbInput != 0) {
        uVar7 = 0;
        do {
          TA_GetInputParameterInfo(handle,uVar7,&inputInfo);
          TVar2 = inputInfo->type;
          if (TVar2 == TA_Input_Integer) {
            TA_SetInputParamIntegerPtr(paramHolder,uVar7,input_int);
          }
          else if (TVar2 == TA_Input_Real) {
            TA_SetInputParamRealPtr(paramHolder,uVar7,input);
          }
          else if (TVar2 == TA_Input_Price) {
            uVar4 = inputInfo->flags;
            open = (TA_Real *)0x0;
            if ((uVar4 & 1) != 0) {
              open = input;
            }
            auVar11._0_4_ = -(uint)((uVar4 & 0x10) == 0);
            auVar11._4_4_ = -(uint)((uVar4 & 8) == 0);
            auVar11._8_4_ = -(uint)((uVar4 & 4) == 0);
            auVar11._12_4_ = -(uint)((uVar4 & 2) == 0);
            uVar4 = movmskps(uVar4,auVar11);
            high = (TA_Real *)0x0;
            if ((uVar4 & 8) == 0) {
              high = input;
            }
            low = (TA_Real *)0x0;
            if ((uVar4 & 4) == 0) {
              low = input;
            }
            close = (TA_Real *)0x0;
            if ((uVar4 & 2) == 0) {
              close = input;
            }
            volume = (TA_Real *)0x0;
            if ((uVar4 & 1) == 0) {
              volume = input;
            }
            TA_SetInputParamPricePtr(paramHolder,uVar7,open,high,low,close,volume,(TA_Real *)0x0);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < funcInfo->nbInput);
      }
      if (funcInfo->nbOutput != 0) {
        paiVar9 = output_int;
        uVar10 = 0;
        padVar8 = output;
        do {
          uVar7 = (uint)uVar10;
          TA_GetOutputParameterInfo(handle,uVar7,&outputInfo);
          if (outputInfo->type == TA_Output_Integer) {
            TA_SetOutputParamIntegerPtr(paramHolder,uVar7,output_int[uVar10]);
            lVar6 = 0;
            do {
              piVar1 = *paiVar9 + lVar6;
              piVar1[0] = -0x7fffffff;
              piVar1[1] = -0x7fffffff;
              piVar1[2] = -0x7fffffff;
              piVar1[3] = -0x7fffffff;
              lVar6 = lVar6 + 4;
            } while (lVar6 != 2000);
          }
          else if (outputInfo->type == TA_Output_Real) {
            TA_SetOutputParamRealPtr(paramHolder,uVar7,output[uVar10]);
            lVar6 = 0;
            do {
              (*padVar8)[lVar6] = -3e+37;
              (*padVar8 + lVar6)[1] = -3e+37;
              lVar6 = lVar6 + 2;
            } while (lVar6 != 2000);
          }
          uVar10 = uVar10 + 1;
          paiVar9 = paiVar9 + 1;
          padVar8 = padVar8 + 1;
        } while (uVar10 < funcInfo->nbOutput);
      }
      TVar3 = TA_CallFunc(paramHolder,0,size + -1,&outBegIdx,&outNbElement);
      if (TVar3 == TA_SUCCESS) {
        TVar3 = TA_GetLookback(paramHolder,&lookback);
        if (TVar3 == TA_SUCCESS) {
          if (outBegIdx == lookback) {
            TVar3 = TA_CallFunc(paramHolder,0,0,&outBegIdx,&outNbElement);
            if (TVar3 == TA_SUCCESS) {
              if (outBegIdx == 0) {
                TVar3 = TA_ParamHolderFree(paramHolder);
                if (TVar3 == TA_SUCCESS) {
                  EVar5 = TA_TEST_PASS;
                }
                else {
                  printf("TA_ParamHolderFree failed [%d]\n",(ulong)TVar3);
                  EVar5 = TA_ABS_TST_FAIL_PARAMHOLDERFREE;
                }
              }
              else {
                printf("failed outBegIdx=%d when startIdx==endIdx==0\n");
                TA_ParamHolderFree(paramHolder);
                EVar5 = TA_ABS_TST_FAIL_STARTEND_ZERO;
              }
            }
            else {
              printf("TA_CallFunc() failed data test 4 [%d]\n",(ulong)TVar3);
              TA_ParamHolderFree(paramHolder);
              EVar5 = TA_ABS_TST_FAIL_CALLFUNC_4;
            }
          }
          else {
            printf("TA_GetLookback() != outBegIdx [%d != %d]\n");
            TA_ParamHolderFree(paramHolder);
            EVar5 = TA_ABS_TST_FAIL_CALLFUNC_3;
          }
        }
        else {
          printf("TA_GetLookback() failed zero data test [%d]\n",(ulong)TVar3);
          TA_ParamHolderFree(paramHolder);
          EVar5 = TA_ABS_TST_FAIL_CALLFUNC_2;
        }
      }
      else {
        printf("TA_CallFunc() failed zero data test [%d]\n",(ulong)TVar3);
        TA_ParamHolderFree(paramHolder);
        EVar5 = TA_ABS_TST_FAIL_CALLFUNC_1;
      }
    }
    else {
      printf("Can\'t allocate the param holder [%d]\n",(ulong)TVar3);
      EVar5 = TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
    }
  }
  else {
    printf("Can\'t get the function handle [%d]\n",(ulong)TVar3);
    EVar5 = TA_ABS_TST_FAIL_GETFUNCHANDLE;
  }
  return EVar5;
}

Assistant:

static ErrorNumber callWithDefaults( const char *funcName, const double *input, const int *input_int, int size )
{
   TA_ParamHolder *paramHolder;
   const TA_FuncHandle *handle;
   const TA_FuncInfo *funcInfo;
   const TA_InputParameterInfo *inputInfo;
   const TA_OutputParameterInfo *outputInfo;

   TA_RetCode retCode;
   unsigned int i;
   int j;
   int outBegIdx, outNbElement, lookback;

   retCode = TA_GetFuncHandle( funcName, &handle );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't get the function handle [%d]\n", retCode );
      return TA_ABS_TST_FAIL_GETFUNCHANDLE;
   }

   retCode = TA_ParamHolderAlloc( handle, &paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't allocate the param holder [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
   }

   TA_GetFuncInfo( handle, &funcInfo );

   for( i=0; i < funcInfo->nbInput; i++ )
   {
      TA_GetInputParameterInfo( handle, i, &inputInfo );
	  switch(inputInfo->type)
	  {
	  case TA_Input_Price:
         TA_SetInputParamPricePtr( paramHolder, i,
			 inputInfo->flags&TA_IN_PRICE_OPEN?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_HIGH?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_LOW?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_CLOSE?input:NULL,
			 inputInfo->flags&TA_IN_PRICE_VOLUME?input:NULL, NULL );
		 break;
	  case TA_Input_Real:
         TA_SetInputParamRealPtr( paramHolder, i, input );
		 break;
	  case TA_Input_Integer:
         TA_SetInputParamIntegerPtr( paramHolder, i, input_int );
         break;
	  }
   }

   for( i=0; i < funcInfo->nbOutput; i++ )
   {
      TA_GetOutputParameterInfo( handle, i, &outputInfo );
	  switch(outputInfo->type)
	  {
	  case TA_Output_Real:
	     TA_SetOutputParamRealPtr(paramHolder,i,&output[i][0]);
         for( j=0; j < 2000; j++ )
            output[i][j] = TA_REAL_MIN;
		 break;
	  case TA_Output_Integer:
	     TA_SetOutputParamIntegerPtr(paramHolder,i,&output_int[i][0]);
         for( j=0; j < 2000; j++ )
            output_int[i][j] = TA_INTEGER_MIN;
		 break;
	  }
   }

   /* Do the function call. */
   retCode = TA_CallFunc(paramHolder,0,size-1,&outBegIdx,&outNbElement);
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_CallFunc() failed zero data test [%d]\n", retCode );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_1;
   }

   /* Verify consistency with Lookback */
   retCode = TA_GetLookback( paramHolder, &lookback );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_GetLookback() failed zero data test [%d]\n", retCode );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_2;
   }

   if( outBegIdx != lookback )
   {
      printf( "TA_GetLookback() != outBegIdx [%d != %d]\n", lookback, outBegIdx );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_3;
   }

   /* TODO Add back nan/inf tests.
   for( i=0; i < funcInfo->nbOutput; i++ )
   {
	  switch(outputInfo->type)
	  {
	  case TA_Output_Real:
		for( j=0; j < outNbElement; j++ )
		{
			if( trio_isnan(output[i][j]) ||
                trio_isinf(output[i][j]))
			{
				printf( "Failed for output[%d][%d] = %e\n", i, j, output[i][j] );
				return TA_ABS_TST_FAIL_INVALID_OUTPUT;
			}
		}
		break;
	  case TA_Output_Integer:
		break;
	  }
   }*/

   /* Do another function call where startIdx == endIdx == 0.
    * In that case, outBegIdx should ALWAYS be zero.
    */
   retCode = TA_CallFunc(paramHolder,0,0,&outBegIdx,&outNbElement);
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_CallFunc() failed data test 4 [%d]\n", retCode );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_CALLFUNC_4;
   }

   if( outBegIdx != 0 )
   {
      printf( "failed outBegIdx=%d when startIdx==endIdx==0\n", outBegIdx );
      TA_ParamHolderFree( paramHolder );
      return TA_ABS_TST_FAIL_STARTEND_ZERO;
   }

   retCode = TA_ParamHolderFree( paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_ParamHolderFree failed [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
   }

   return TA_TEST_PASS;
}